

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

string * __thiscall
t_php_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_type *type,t_const_value *value)

{
  __type _Var1;
  bool bVar2;
  uint uVar3;
  t_const_value_type tVar4;
  int iVar5;
  t_struct *this_00;
  int64_t iVar6;
  t_program *p;
  undefined4 extraout_var;
  reference pptVar7;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_00;
  t_type *ptVar8;
  t_type *type_00;
  pointer ppVar9;
  ostream *poVar10;
  reference pptVar11;
  char *pcVar12;
  double dVar13;
  undefined1 auVar14 [12];
  string local_440;
  string local_420;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_400;
  t_const_value **local_3f8;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_3f0;
  const_iterator v_iter_2;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *val_2;
  t_type *etype;
  string local_3b8;
  string local_398;
  _Self local_378;
  _Base_ptr local_370;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_368;
  const_iterator v_iter_1;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val_1;
  t_type *vtype;
  t_type *ktype;
  string local_328;
  string local_308;
  undefined1 local_2e1;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_260
  ;
  t_field **local_258;
  t_type *local_250;
  t_type *field_type;
  _Base_ptr local_240;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_238;
  const_iterator v_iter;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  undefined1 local_1f1;
  string local_1f0;
  string local_1d0;
  t_base local_1b0;
  t_base tbase;
  undefined1 local_1a0 [8];
  ostringstream out;
  t_const_value *value_local;
  t_type *type_local;
  t_php_generator *this_local;
  
  out._368_8_ = value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  this_00 = (t_struct *)t_generator::get_true_type(type);
  uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])();
  if ((uVar3 & 1) == 0) {
    uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[10])();
    if ((uVar3 & 1) == 0) {
      uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xb])();
      if (((uVar3 & 1) == 0) &&
         (uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
        uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0x10])();
        if ((uVar3 & 1) == 0) {
          uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xe])();
          if (((uVar3 & 1) != 0) ||
             (uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xf])(), (uVar3 & 1) != 0))
          {
            uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xe])();
            if ((uVar3 & 1) == 0) {
              val_2 = (vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                      t_set::get_elem_type((t_set *)this_00);
            }
            else {
              val_2 = (vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                      t_list::get_elem_type((t_list *)this_00);
            }
            poVar10 = std::operator<<((ostream *)local_1a0,"array(");
            std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
            t_generator::indent_up((t_generator *)this);
            v_iter_2._M_current =
                 (t_const_value **)t_const_value::get_list((t_const_value *)out._368_8_);
            __gnu_cxx::
            __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
            ::__normal_iterator(&local_3f0);
            local_3f8 = (t_const_value **)
                        std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                                  (v_iter_2._M_current);
            local_3f0._M_current = local_3f8;
            while( true ) {
              local_400._M_current =
                   (t_const_value **)
                   std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                             (v_iter_2._M_current);
              bVar2 = __gnu_cxx::operator!=(&local_3f0,&local_400);
              if (!bVar2) break;
              t_generator::indent_abi_cxx11_(&local_420,(t_generator *)this);
              std::operator<<((ostream *)local_1a0,(string *)&local_420);
              std::__cxx11::string::~string((string *)&local_420);
              pptVar11 = __gnu_cxx::
                         __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                         ::operator*(&local_3f0);
              render_const_value_abi_cxx11_(&local_440,this,(t_type *)val_2,*pptVar11);
              std::operator<<((ostream *)local_1a0,(string *)&local_440);
              std::__cxx11::string::~string((string *)&local_440);
              uVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xf])();
              if ((uVar3 & 1) != 0) {
                std::operator<<((ostream *)local_1a0," => true");
              }
              poVar10 = std::operator<<((ostream *)local_1a0,",");
              std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
              __gnu_cxx::
              __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
              ::operator++(&local_3f0);
            }
            t_generator::indent_down((t_generator *)this);
            poVar10 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
            std::operator<<(poVar10,")");
          }
        }
        else {
          ptVar8 = t_map::get_key_type((t_map *)this_00);
          type_00 = t_map::get_val_type((t_map *)this_00);
          poVar10 = std::operator<<((ostream *)local_1a0,"array(");
          std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
          t_generator::indent_up((t_generator *)this);
          v_iter_1._M_node = (_Base_ptr)t_const_value::get_map((t_const_value *)out._368_8_);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          _Rb_tree_const_iterator(&local_368);
          local_370 = (_Base_ptr)
                      std::
                      map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                      ::begin(v_iter_1._M_node);
          local_368._M_node = local_370;
          while( true ) {
            local_378._M_node =
                 (_Base_ptr)
                 std::
                 map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 ::end(v_iter_1._M_node);
            bVar2 = std::operator!=(&local_368,&local_378);
            if (!bVar2) break;
            t_generator::indent_abi_cxx11_(&local_398,(t_generator *)this);
            std::operator<<((ostream *)local_1a0,(string *)&local_398);
            std::__cxx11::string::~string((string *)&local_398);
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_368);
            render_const_value_abi_cxx11_(&local_3b8,this,ptVar8,ppVar9->first);
            std::operator<<((ostream *)local_1a0,(string *)&local_3b8);
            std::__cxx11::string::~string((string *)&local_3b8);
            std::operator<<((ostream *)local_1a0," => ");
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_368);
            render_const_value_abi_cxx11_((string *)&etype,this,type_00,ppVar9->second);
            std::operator<<((ostream *)local_1a0,(string *)&etype);
            std::__cxx11::string::~string((string *)&etype);
            poVar10 = std::operator<<((ostream *)local_1a0,",");
            std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
            std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            operator++(&local_368);
          }
          t_generator::indent_down((t_generator *)this);
          poVar10 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
          std::operator<<(poVar10,")");
        }
      }
      else {
        poVar10 = std::operator<<((ostream *)local_1a0,"new ");
        p = t_type::get_program((t_type *)this_00);
        php_namespace_abi_cxx11_((string *)&fields,this,p);
        poVar10 = std::operator<<(poVar10,(string *)&fields);
        iVar5 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar10 = std::operator<<(poVar10,(string *)CONCAT44(extraout_var,iVar5));
        poVar10 = std::operator<<(poVar10,"(array(");
        std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&fields);
        t_generator::indent_up((t_generator *)this);
        f_iter._M_current = (t_field **)t_struct::get_members(this_00);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)&val);
        v_iter._M_node = (_Base_ptr)t_const_value::get_map((t_const_value *)out._368_8_);
        std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
        _Rb_tree_const_iterator(&local_238);
        local_240 = (_Base_ptr)
                    std::
                    map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                    ::begin(v_iter._M_node);
        local_238._M_node = local_240;
        while( true ) {
          field_type = (t_type *)
                       std::
                       map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                       ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                              *)v_iter._M_node);
          bVar2 = std::operator!=(&local_238,(_Self *)&field_type);
          if (!bVar2) break;
          local_250 = (t_type *)0x0;
          local_258 = (t_field **)
                      std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
          val = (map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 *)local_258;
          while( true ) {
            local_260._M_current =
                 (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&val,&local_260);
            if (!bVar2) break;
            pptVar7 = __gnu_cxx::
                      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                      ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                   *)&val);
            __lhs = t_field::get_name_abi_cxx11_(*pptVar7);
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_238);
            t_const_value::get_string_abi_cxx11_(&local_280,ppVar9->first);
            _Var1 = std::operator==(__lhs,&local_280);
            std::__cxx11::string::~string((string *)&local_280);
            if (_Var1) {
              pptVar7 = __gnu_cxx::
                        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                     *)&val);
              local_250 = t_field::get_type(*pptVar7);
            }
            __gnu_cxx::
            __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
            ::operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&val);
          }
          if (local_250 == (t_type *)0x0) {
            local_2e1 = 1;
            __return_storage_ptr___00 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
            iVar5 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[3])();
            std::operator+(&local_2c0,"type error: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar5));
            std::operator+(&local_2a0,&local_2c0," has no field ");
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_238);
            t_const_value::get_string_abi_cxx11_(&local_2e0,ppVar9->first);
            std::operator+(__return_storage_ptr___00,&local_2a0,&local_2e0);
            local_2e1 = 0;
            __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                        std::__cxx11::string::~string);
          }
          t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
          std::operator<<((ostream *)local_1a0,(string *)&local_308);
          std::__cxx11::string::~string((string *)&local_308);
          ptVar8 = g_type_string;
          ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                   operator->(&local_238);
          render_const_value_abi_cxx11_(&local_328,this,ptVar8,ppVar9->first);
          std::operator<<((ostream *)local_1a0,(string *)&local_328);
          std::__cxx11::string::~string((string *)&local_328);
          std::operator<<((ostream *)local_1a0," => ");
          ptVar8 = local_250;
          ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                   operator->(&local_238);
          render_const_value_abi_cxx11_((string *)&ktype,this,ptVar8,ppVar9->second);
          std::operator<<((ostream *)local_1a0,(string *)&ktype);
          std::__cxx11::string::~string((string *)&ktype);
          poVar10 = std::operator<<((ostream *)local_1a0,",");
          std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          operator++(&local_238);
        }
        t_generator::indent_down((t_generator *)this);
        poVar10 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
        std::operator<<(poVar10,"))");
      }
    }
    else {
      poVar10 = t_generator::indent((t_generator *)this,(ostream *)local_1a0);
      iVar6 = t_const_value::get_integer((t_const_value *)out._368_8_);
      std::ostream::operator<<(poVar10,iVar6);
    }
  }
  else {
    local_1b0 = t_base_type::get_base((t_base_type *)this_00);
    switch(local_1b0) {
    case TYPE_STRING:
      poVar10 = std::operator<<((ostream *)local_1a0,'\"');
      t_generator::get_escaped_string_abi_cxx11_
                (&local_1d0,(t_generator *)this,(t_const_value *)out._368_8_);
      poVar10 = std::operator<<(poVar10,(string *)&local_1d0);
      std::operator<<(poVar10,'\"');
      std::__cxx11::string::~string((string *)&local_1d0);
      break;
    case TYPE_BOOL:
      iVar6 = t_const_value::get_integer((t_const_value *)out._368_8_);
      pcVar12 = "false";
      if (0 < iVar6) {
        pcVar12 = "true";
      }
      std::operator<<((ostream *)local_1a0,pcVar12);
      break;
    case TYPE_I8:
    case TYPE_I16:
    case TYPE_I32:
    case TYPE_I64:
      iVar6 = t_const_value::get_integer((t_const_value *)out._368_8_);
      std::ostream::operator<<(local_1a0,iVar6);
      break;
    case TYPE_DOUBLE:
      tVar4 = t_const_value::get_type((t_const_value *)out._368_8_);
      if (tVar4 == CV_INTEGER) {
        iVar6 = t_const_value::get_integer((t_const_value *)out._368_8_);
        std::ostream::operator<<(local_1a0,iVar6);
      }
      else {
        dVar13 = t_const_value::get_double((t_const_value *)out._368_8_);
        std::ostream::operator<<(local_1a0,dVar13);
      }
      break;
    default:
      local_1f1 = 1;
      auVar14 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_1f0,(t_base_type *)(ulong)local_1b0,auVar14._8_4_);
      std::operator+(auVar14._0_8_,"compiler error: no const of base type ",&local_1f0);
      local_1f1 = 0;
      __cxa_throw(auVar14._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string t_php_generator::render_const_value(t_type* type, t_const_value* value) {
  std::ostringstream out;
  type = get_true_type(type);
  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    indent(out) << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << "new " << php_namespace(type->get_program()) << type->get_name() << "(array(" << endl;
    indent_up();
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      out << indent();
      out << render_const_value(g_type_string, v_iter->first);
      out << " => ";
      out << render_const_value(field_type, v_iter->second);
      out << "," << endl;
    }
    indent_down();
    indent(out) << "))";
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    out << "array(" << endl;
    indent_up();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent();
      out << render_const_value(ktype, v_iter->first);
      out << " => ";
      out << render_const_value(vtype, v_iter->second);
      out << "," << endl;
    }
    indent_down();
    indent(out) << ")";
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    out << "array(" << endl;
    indent_up();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent();
      out << render_const_value(etype, *v_iter);
      if (type->is_set()) {
        out << " => true";
      }
      out << "," << endl;
    }
    indent_down();
    indent(out) << ")";
  }
  return out.str();
}